

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

bool ghc::filesystem::copy_file(path *from,path *to,copy_options option)

{
  bool bVar1;
  int code;
  filesystem_error *this;
  error_code ec_00;
  string local_58;
  byte local_31;
  undefined1 auStack_30 [7];
  bool result;
  error_code ec;
  copy_options option_local;
  path *to_local;
  path *from_local;
  
  ec._M_cat._6_2_ = option;
  std::error_code::error_code((error_code *)auStack_30);
  local_31 = copy_file(from,to,ec._M_cat._6_2_,(error_code *)auStack_30);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)auStack_30);
  if (!bVar1) {
    return (bool)(local_31 & 1);
  }
  this = (filesystem_error *)__cxa_allocate_exception(0x90);
  code = std::error_code::value((error_code *)auStack_30);
  detail::systemErrorText<int>(&local_58,code);
  ec_00._0_8_ = _auStack_30 & 0xffffffff;
  ec_00._M_cat = (error_category *)ec._0_8_;
  filesystem_error::filesystem_error(this,&local_58,from,to,ec_00);
  __cxa_throw(this,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE bool copy_file(const path& from, const path& to, copy_options option)
{
    std::error_code ec;
    auto result = copy_file(from, to, option, ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), from, to, ec);
    }
    return result;
}